

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

void __thiscall
Fl_Input_::handle_mouse(Fl_Input_ *this,int X,int Y,int param_3,int param_4,int drag)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  undefined4 in_register_0000000c;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  char buf [1024];
  double local_440;
  char local_438 [1032];
  
  was_up_down = 0;
  if (this->size_ != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_,
               CONCAT44(in_register_0000000c,param_3));
    iVar5 = 0;
    if (((this->super_Fl_Widget).type_ & 7) == 4) {
      iVar14 = Fl::e_y - Y;
      iVar1 = this->yscroll_;
      iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar5 = (iVar14 + iVar1) / iVar5;
    }
    pcVar15 = this->value_;
    pcVar8 = expand(this,pcVar15,local_438);
    if ((0 < iVar5) && (pcVar8 < this->value_ + this->size_)) {
      iVar5 = iVar5 + 1;
      do {
        pcVar15 = pcVar8 + 1;
        pcVar8 = expand(this,pcVar15,local_438);
        iVar5 = iVar5 + -1;
        if (iVar5 < 2) break;
      } while (pcVar8 < this->value_ + this->size_);
    }
    local_440 = (double)((Fl::e_x - X) + this->xscroll_);
    pcVar13 = pcVar15;
    if (pcVar15 < pcVar8) {
      pcVar12 = pcVar8;
      do {
        uVar6 = fl_utf8len(*pcVar13);
        if ((int)uVar6 < 2) {
          uVar6 = 1;
        }
        iVar5 = this->xscroll_;
        dVar17 = expandpos(this,pcVar15,pcVar13 + uVar6,local_438,(int *)0x0);
        dVar17 = dVar17 + (double)(X - iVar5);
        pcVar4 = pcVar13;
        if (dVar17 <= (double)Fl::e_x) {
          local_440 = (double)Fl::e_x - dVar17;
          pcVar13 = pcVar13 + uVar6;
          pcVar4 = pcVar12;
        }
        pcVar12 = pcVar4;
      } while (pcVar13 < pcVar12);
    }
    if ((pcVar13 < pcVar8) && (uVar6 = fl_utf8len(*pcVar13), 0 < (int)uVar6)) {
      iVar5 = this->xscroll_;
      dVar17 = expandpos(this,pcVar15,pcVar13 + uVar6,local_438,(int *)0x0);
      if ((dVar17 + (double)(X - iVar5)) - (double)Fl::e_x < local_440) {
        pcVar13 = pcVar13 + uVar6;
      }
    }
    pcVar15 = this->value_;
    uVar16 = (long)pcVar13 - (long)pcVar15;
    uVar6 = (uint)uVar16;
    uVar10 = uVar16 & 0xffffffff;
    if (drag != 0) {
      uVar10 = (ulong)(uint)this->mark_;
    }
    uVar11 = (uint)uVar10;
    if (Fl::e_clicks != 0) {
      if ((int)uVar6 < (int)uVar11) {
        if (Fl::e_clicks < 2) {
          bVar9 = (this->super_Fl_Widget).type_ & 7;
          if (bVar9 == 5) {
            uVar6 = 0;
          }
          else if (0 < (int)uVar6) {
            uVar16 = (ulong)(uVar6 & 0x7fffffff);
            do {
              iVar5 = isspace((int)pcVar15[uVar16 - 1]);
              if (iVar5 != 0) goto LAB_00182d1f;
              bVar3 = 1 < (long)uVar16;
              uVar16 = uVar16 - 1;
            } while (bVar3);
            uVar16 = 0;
LAB_00182d1f:
            uVar6 = (uint)uVar16;
          }
          uVar2 = this->size_;
          uVar7 = uVar2;
          if ((bVar9 != 5) && (uVar7 = uVar11, (int)uVar11 < (int)uVar2)) {
            pcVar15 = pcVar15 + (int)uVar11;
            do {
              iVar5 = isspace((int)*pcVar15);
              uVar7 = (uint)uVar10;
              if (iVar5 != 0) break;
              uVar11 = (uint)uVar10 + 1;
              uVar10 = (ulong)uVar11;
              pcVar15 = pcVar15 + 1;
              uVar7 = uVar2;
            } while (uVar2 != uVar11);
          }
        }
        else {
          uVar6 = line_start(this,uVar6);
          uVar7 = line_end(this,uVar11);
        }
      }
      else {
        if (uVar11 == uVar6) {
          if ((int)uVar6 < this->size_) {
            uVar16 = (ulong)(uVar6 + 1);
          }
          else {
            uVar10 = (ulong)(uVar11 - 1);
          }
        }
        uVar11 = (uint)uVar10;
        uVar7 = (uint)uVar16;
        if (Fl::e_clicks < 2) {
          uVar2 = this->size_;
          bVar9 = (this->super_Fl_Widget).type_;
          uVar6 = uVar2;
          if (((bVar9 & 7) != 5) && (uVar6 = uVar7, (int)uVar7 < (int)uVar2)) {
            pcVar8 = pcVar15 + (int)uVar7;
            do {
              iVar5 = isspace((int)*pcVar8);
              uVar6 = (uint)uVar16;
              if (iVar5 != 0) break;
              uVar7 = (uint)uVar16 + 1;
              uVar16 = (ulong)uVar7;
              pcVar8 = pcVar8 + 1;
              uVar6 = uVar2;
            } while (uVar2 != uVar7);
          }
          uVar7 = 0;
          if (((bVar9 & 7) != 5) && (uVar7 = uVar11, 0 < (int)uVar11)) {
            do {
              iVar5 = isspace((int)pcVar15[uVar10 - 1]);
              if (iVar5 != 0) {
                uVar7 = (uint)uVar10;
                break;
              }
              bVar3 = 1 < (long)uVar10;
              uVar10 = uVar10 - 1;
              uVar7 = 0;
            } while (bVar3);
          }
        }
        else {
          uVar6 = line_end(this,uVar7);
          uVar7 = line_start(this,uVar11);
        }
      }
      uVar11 = uVar7;
      if (drag == 0) {
        iVar5 = this->position_;
        iVar1 = this->mark_;
        iVar14 = iVar5;
        if (iVar5 < iVar1) {
          iVar14 = iVar1;
          iVar1 = iVar5;
        }
        if ((iVar1 <= (int)uVar11) && ((int)uVar6 <= iVar14)) {
          Fl::e_clicks = 0;
          uVar6 = (int)pcVar13 - *(int *)&this->value_;
          uVar11 = uVar6;
        }
      }
    }
    position(this,uVar6,uVar11);
  }
  return;
}

Assistant:

void Fl_Input_::handle_mouse(int X, int Y, int /*W*/, int /*H*/, int drag) {
  was_up_down = 0;
  if (!size()) return;
  setfont();

  const char *p, *e;
  char buf[MAXBUF];

  int theline = (input_type()==FL_MULTILINE_INPUT) ?
    (Fl::event_y()-Y+yscroll_)/fl_height() : 0;

  int newpos = 0;
  for (p=value();; ) {
    e = expand(p, buf);
    theline--; if (theline < 0) break;
    if (e >= value_+size_) break;
    p = e+1;
  }
  const char *l, *r, *t; double f0 = Fl::event_x()-X+xscroll_;
  for (l = p, r = e; l<r; ) {
    double f;
    int cw = fl_utf8len((char)l[0]);
    if (cw < 1) cw = 1;
    t = l+cw;
    f = X-xscroll_+expandpos(p, t, buf, 0);
    if (f <= Fl::event_x()) {l = t; f0 = Fl::event_x()-f;}
    else r = t-cw;
  }
  if (l < e) { // see if closer to character on right:
    double f1;
    int cw = fl_utf8len((char)l[0]);
    if (cw > 0) {
      f1 = X-xscroll_+expandpos(p, l + cw, buf, 0) - Fl::event_x();
      if (f1 < f0) l = l+cw;
    }
  }
  newpos = (int) (l-value());

  int newmark = drag ? mark() : newpos;
  if (Fl::event_clicks()) {
    if (newpos >= newmark) {
      if (newpos == newmark) {
	if (newpos < size()) newpos++;
	else newmark--;
      }
      if (Fl::event_clicks() > 1) {
	newpos = line_end(newpos);
	newmark = line_start(newmark);
      } else {
	newpos = strict_word_end(value(), size(), newpos, input_type());
	newmark = strict_word_start(value(), newmark, input_type());
      }
    } else {
      if (Fl::event_clicks() > 1) {
	newpos = line_start(newpos);
	newmark = line_end(newmark);
      } else {
	newpos = strict_word_start(value(), newpos, input_type());
	newmark = strict_word_end(value(), size(), newmark, input_type());
      }
    }
    // if the multiple click does not increase the selection, revert
    // to single-click behavior:
    if (!drag && (mark() > position() ?
                  (newmark >= position() && newpos <= mark()) :
                  (newmark >= mark() && newpos <= position()))) {
      Fl::event_clicks(0);
      newmark = newpos = (int) (l-value());
    }
  }
  position(newpos, newmark);
}